

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O1

int archive_utility_string_sort_helper(char **strings,uint n)

{
  char *__s2;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  char **strings_00;
  uint n_00;
  ulong uVar7;
  uint n_01;
  char **local_40;
  
  iVar4 = 0;
  if (1 < n) {
    __s2 = *strings;
    n_01 = 0;
    uVar7 = 1;
    local_40 = (char **)0x0;
    strings_00 = (char **)0x0;
    n_00 = 0;
    do {
      iVar4 = strcmp(strings[uVar7],__s2);
      if (iVar4 < 0) {
        ppcVar6 = (char **)realloc(strings_00,(ulong)(n_01 + 1) * 8);
        uVar2 = n_00;
        strings_00 = ppcVar6;
        uVar3 = n_01 + 1;
        uVar1 = n_01;
      }
      else {
        ppcVar6 = (char **)realloc(local_40,(ulong)(n_00 + 1) * 8);
        uVar2 = n_00 + 1;
        local_40 = ppcVar6;
        uVar3 = n_01;
        uVar1 = n_00;
      }
      n_01 = uVar3;
      n_00 = uVar2;
      if (ppcVar6 == (char **)0x0) {
        return -0x1e;
      }
      ppcVar6[uVar1] = strings[uVar7];
      uVar7 = uVar7 + 1;
    } while (n != uVar7);
    iVar5 = archive_utility_string_sort_helper(strings_00,n_01);
    if (n_01 != 0) {
      uVar7 = 0;
      do {
        strings[uVar7] = strings_00[uVar7];
        uVar7 = uVar7 + 1;
      } while (n_01 != uVar7);
    }
    free(strings_00);
    strings[n_01] = __s2;
    iVar4 = archive_utility_string_sort_helper(local_40,n_00);
    if (n_00 != 0) {
      uVar7 = 0;
      do {
        strings[n_01 + 1 + (int)uVar7] = local_40[uVar7];
        uVar7 = uVar7 + 1;
      } while (n_00 != uVar7);
    }
    free(local_40);
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_utility_string_sort_helper(char **strings, unsigned int n)
{
  unsigned int i, lesser_count, greater_count;
  char **lesser, **greater, **tmp, *pivot;
  int retval1, retval2;

  /* A list of 0 or 1 elements is already sorted */
  if (n <= 1)
    return (ARCHIVE_OK);

  lesser_count = greater_count = 0;
  lesser = greater = NULL;
  pivot = strings[0];
  for (i = 1; i < n; i++)
  {
    if (strcmp(strings[i], pivot) < 0)
    {
      lesser_count++;
      tmp = (char **)realloc(lesser, lesser_count * sizeof(char *));
      if (!tmp)
        return (ARCHIVE_FATAL);
      lesser = tmp;
      lesser[lesser_count - 1] = strings[i];
    }
    else
    {
      greater_count++;
      tmp = (char **)realloc(greater, greater_count * sizeof(char *));
      if (!tmp)
        return (ARCHIVE_FATAL);
      greater = tmp;
      greater[greater_count - 1] = strings[i];
    }
  }

  /* quicksort(lesser) */
  retval1 = archive_utility_string_sort_helper(lesser, lesser_count);
  for (i = 0; i < lesser_count; i++)
    strings[i] = lesser[i];
  free(lesser);

  /* pivot */
  strings[lesser_count] = pivot;

  /* quicksort(greater) */
  retval2 = archive_utility_string_sort_helper(greater, greater_count);
  for (i = 0; i < greater_count; i++)
    strings[lesser_count + 1 + i] = greater[i];
  free(greater);

  return (retval1 < retval2) ? retval1 : retval2;
}